

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cc
# Opt level: O2

void __thiscall raptor::InternalThreadImpl::Join(InternalThreadImpl *this)

{
  if (this->_join_object != 0) {
    pthread_join(this->_join_object,(void **)0x0);
    return;
  }
  return;
}

Assistant:

void Join() {
        if (_join_object != 0) {
#ifdef _WIN32
            WaitForSingleObject(_join_object, INFINITE);
            CloseHandle(_join_object);
#else
            pthread_join(_join_object, nullptr);
#endif
        }
    }